

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O1

uint labpack_read_uint(labpack_reader_t *reader)

{
  mpack_error_t error;
  uint32_t uVar1;
  char *pcVar2;
  
  if (reader != (labpack_reader_t *)0x0) {
    uVar1 = 0;
    if (reader->status == LABPACK_STATUS_OK) {
      uVar1 = mpack_expect_u32(reader->decoder);
      error = reader->decoder->error;
      if (error != mpack_ok) {
        reader->status = LABPACK_STATUS_ERROR_DECODER;
        pcVar2 = labpack_mpack_error_message(error);
        reader->status_message = pcVar2;
      }
    }
    return uVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0xc4,"unsigned int labpack_read_uint(labpack_reader_t *)");
}

Assistant:

unsigned int
labpack_read_uint(labpack_reader_t* reader)
{
    assert(reader);
    unsigned int value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_uint(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}